

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O3

uint dasm_read_imm_8(uint advance)

{
  uint uVar1;
  
  if (g_rawop == (uchar *)0x0) {
    uVar1 = m68k_read_disassembler_16((g_address_mask - 1 | 0xffffff) & g_cpu_pc);
    uVar1 = uVar1 & 0xff;
  }
  else {
    uVar1 = (uint)g_rawop[(g_cpu_pc - g_rawbasepc) + 1];
  }
  g_cpu_pc = g_cpu_pc + 2;
  return uVar1;
}

Assistant:

static uint dasm_read_imm_8(uint advance)
{
	uint result;
	if (g_rawop)
		result = g_rawop[g_cpu_pc + 1 - g_rawbasepc];
	else
		result = m68k_read_disassembler_16(g_cpu_pc & g_address_mask) & 0xff;
	g_cpu_pc += advance;
	return result;
}